

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O0

void __thiscall
Multiqueues<int>::Multiqueues(Multiqueues<int> *this,int numOfThreads,int numOfQueuesPerThread)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  id *piVar7;
  ulong *puVar8;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  ulong uVar9;
  value_compare *in_stack_ffffffffffffff38;
  d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  *in_stack_ffffffffffffff40;
  void *local_a8;
  ulong *local_80;
  id *local_48;
  
  in_RDI[2] = 2;
  pvVar4 = operator_new__(4);
  *(void **)(in_RDI + 4) = pvVar4;
  in_RDI[0xc] = 0;
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ESI * in_EDX;
  uVar5 = (ulong)in_ESI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (id *)operator_new__(uVar6);
  if (uVar5 != 0) {
    local_48 = piVar7;
    do {
      std::thread::id::id(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != piVar7 + uVar5);
  }
  *(id **)(in_RDI + 10) = piVar7;
  uVar5 = (ulong)in_RDI[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(0x30),0);
  uVar9 = uVar6 + 8;
  if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar9);
  *puVar8 = uVar5;
  puVar8 = puVar8 + 1;
  if (uVar5 != 0) {
    local_80 = puVar8;
    do {
      boost::heap::
      d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::d_ary_heap(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_80 = local_80 + 6;
    } while (local_80 != puVar8 + uVar5 * 6);
  }
  *(ulong **)(in_RDI + 6) = puVar8;
  uVar5 = (ulong)in_RDI[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(0x28),0);
  if (SUB168(auVar3 * ZEXT816(0x28),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar6);
  if (uVar5 != 0) {
    local_a8 = pvVar4;
    do {
      std::mutex::mutex((mutex *)0x103e3c);
      local_a8 = (void *)((long)local_a8 + 0x28);
    } while (local_a8 != (void *)((long)pvVar4 + uVar5 * 0x28));
  }
  *(void **)(in_RDI + 8) = pvVar4;
  return;
}

Assistant:

Multiqueues(int numOfThreads, int numOfQueuesPerThread) {
        this->numOfThreads = numOfThreads;
        this->numOfQueuesPerThread = numOfQueuesPerThread;
        this->numOfQueues = numOfThreads * numOfQueuesPerThread;
        this->threadsMap = new std::thread::id[numOfThreads];
        internalQueues = new PriorityQueue[numOfQueues];
        locks = new std::mutex[numOfQueues];
    }